

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindBlitCase::render
          (InvalidateSubFboUnbindBlitCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ChannelOrder CVar4;
  deUint32 program;
  Context *pCVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  int local_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  Vec4 local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  Vec3 local_1a8;
  undefined1 local_198 [16];
  FlatColorShader flatShader;
  TextureFormat TVar5;
  
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  _local_1e8 = ZEXT416((uint)this->m_numSamples);
  uVar1 = sglr::ContextWrapper::getWidth(this_00);
  local_198 = ZEXT416((uint)this->m_numSamples);
  uVar2 = sglr::ContextWrapper::getHeight(this_00);
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  local_1ec = sglr::ContextWrapper::getHeight(this_00);
  if (this->m_depthStencilFmt == 0) {
    CVar4 = CHANNELORDER_LAST;
  }
  else {
    TVar5 = glu::mapGLInternalFormat(this->m_depthStencilFmt);
    CVar4 = TVar5.order;
  }
  fbo = 0;
  colorRbo = 0;
  depthStencilRbo = 0;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  getFBODiscardAttachments(&attachments,this->m_invalidateBuffers);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,&flatShader);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  uVar1 = ~-(uint)(local_1e8._0_4_ == 0) &
          (~-(uint)((int)uVar1 < 0x80) & 0x80 | uVar1 & -(uint)((int)uVar1 < 0x80)) |
          uVar1 & -(uint)(local_1e8._0_4_ == 0);
  uVar2 = ~-(uint)(local_198._0_4_ == 0) &
          (~-(uint)((int)uVar2 < 0x80) & 0x80 | uVar2 & -(uint)((int)uVar2 < 0x80)) |
          uVar2 & -(uint)(local_198._0_4_ == 0);
  local_1e8._4_4_ = uVar2;
  local_1e8._0_4_ = uVar1;
  _fStack_1e0 = 0;
  sglr::ContextWrapper::glRenderbufferStorageMultisample
            (this_00,0x8d41,this->m_numSamples,this->m_colorFmt,uVar1,uVar2);
  if (this->m_depthStencilFmt != 0) {
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthStencilRbo);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthStencilRbo);
    sglr::ContextWrapper::glRenderbufferStorageMultisample
              (this_00,0x8d41,this->m_numSamples,this->m_depthStencilFmt,uVar1,uVar2);
  }
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  if ((CVar4 == DS) || (CVar4 == D)) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthStencilRbo);
  }
  if (CVar4 - S < 2) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,depthStencilRbo);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d8.m_data[0] = 1.0;
  local_1d8.m_data[1] = 0.0;
  local_1d8.m_data[2] = 0.0;
  local_1d8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program,&local_1d8);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  auVar8._0_4_ = (float)(int)local_1e8._0_4_ + (float)(int)local_1e8._0_4_;
  auVar8._4_4_ = (float)(int)local_1e8._4_4_ + (float)(int)local_1e8._4_4_;
  auVar8._8_4_ = (float)(int)fStack_1e0 + (float)(int)fStack_1e0;
  auVar8._12_4_ = (float)(int)fStack_1dc + (float)(int)fStack_1dc;
  auVar9._0_4_ = (float)iVar3;
  auVar9._4_4_ = (float)local_1ec;
  auVar9._8_8_ = 0;
  auVar9 = divps(auVar8,auVar9);
  local_1e8._0_4_ = auVar9._0_4_ + -1.0;
  local_1e8._4_4_ = auVar9._4_4_ + -1.0;
  local_1d8.m_data[0] = -1.0;
  local_1d8.m_data[1] = -1.0;
  local_1d8.m_data[2] = -1.0;
  fStack_1e0 = auVar9._8_4_ + 0.0;
  fStack_1dc = auVar9._12_4_ + 0.0;
  local_1a8.m_data[1] = (float)local_1e8._4_4_;
  local_1a8.m_data[0] = (float)local_1e8._0_4_;
  local_1a8.m_data[2] = 1.0;
  sglr::drawQuad(pCVar6,program,(Vec3 *)&local_1d8,&local_1a8);
  iVar3 = (int)uVar1 / 2;
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),
             attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0,0,iVar3,uVar2);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,0);
  uVar7 = uVar1 - ((int)uVar1 >> 0x1f) & 0xfffffffe;
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,iVar3,0,uVar7,uVar2,iVar3,0,uVar7,uVar2,~this->m_invalidateBuffers & 0x4500,
             0x2600);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,0);
  uVar7 = this->m_invalidateBuffers;
  if ((uVar7 >> 0xe & 1) != 0) {
    sglr::ContextWrapper::glDisable(this_00,0xb71);
    sglr::ContextWrapper::glDisable(this_00,0xb90);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1d8.m_data[0] = 0.0;
    local_1d8.m_data[1] = 1.0;
    local_1d8.m_data[2] = 0.0;
    local_1d8.m_data[3] = 1.0;
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program,&local_1d8);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    auVar9 = _local_1e8;
    local_1d8.m_data[0] = -1.0;
    local_1d8.m_data[1] = -1.0;
    local_1d8.m_data._8_8_ = local_1d8.m_data._8_8_ & 0xffffffff00000000;
    local_1a8.m_data[0] = (float)local_1e8._0_4_;
    local_1a8.m_data[1] = (float)local_1e8._4_4_;
    local_1a8.m_data[2] = 0.0;
    _local_1e8 = auVar9;
    sglr::drawQuad(pCVar6,program,(Vec3 *)&local_1d8,&local_1a8);
    sglr::ContextWrapper::glEnable(this_00,0xb71);
    sglr::ContextWrapper::glEnable(this_00,0xb90);
    uVar7 = this->m_invalidateBuffers;
  }
  if ((uVar7 >> 8 & 1) != 0) {
    sglr::ContextWrapper::glDepthFunc(this_00,0x207);
    uVar7 = this->m_invalidateBuffers;
  }
  if ((uVar7 >> 10 & 1) == 0) {
    sglr::ContextWrapper::glStencilFunc(this_00,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d8.m_data[0] = 0.0;
  local_1d8.m_data[1] = 0.0;
  local_1d8.m_data[2] = 1.0;
  local_1d8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program,&local_1d8);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  auVar9 = _local_1e8;
  local_1d8.m_data[0] = -1.0;
  local_1d8.m_data[1] = -1.0;
  local_1d8.m_data._8_8_ = local_1d8.m_data._8_8_ & 0xffffffff00000000;
  local_1a8.m_data[0] = (float)local_1e8._0_4_;
  local_1a8.m_data[1] = (float)local_1e8._4_4_;
  local_1a8.m_data[2] = 0.0;
  _local_1e8 = auVar9;
  sglr::drawQuad(pCVar6,program,(Vec3 *)&local_1d8,&local_1a8);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,uVar1,uVar2);
  if (attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		// \note When using fullscreen viewport (when m_numSamples > 0), still only use a 128x128 pixel quad at most.
		IVec2					quadSizePixels			(m_numSamples == 0 ? getWidth() : de::min(128, getWidth()),
														 m_numSamples == 0 ? getHeight() : de::min(128, getHeight()));
		Vec2					quadNDCLeftBottomXY		(-1.0f, -1.0f);
		Vec2					quadNDCSize				(2.0f*(float)quadSizePixels.x()/(float)getWidth(), 2.0f*(float)quadSizePixels.y()/(float)getHeight());
		Vec2					quadNDCRightTopXY		= quadNDCLeftBottomXY + quadNDCSize;
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		deUint32				fbo						= 0;
		deUint32				colorRbo				= 0;
		deUint32				depthStencilRbo			= 0;
		int						invalidateX				= 0;
		int						invalidateY				= 0;
		int						invalidateW				= quadSizePixels.x()/2;
		int						invalidateH				= quadSizePixels.y();
		int						blitX0					= invalidateW;
		int						blitY0					= 0;
		int						blitX1					= blitX0 + quadSizePixels.x()/2;
		int						blitY1					= blitY0 + quadSizePixels.y();
		FlatColorShader			flatShader				(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenRenderbuffers					(1, &colorRbo);
		glBindRenderbuffer					(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorageMultisample	(GL_RENDERBUFFER, m_numSamples, m_colorFmt, quadSizePixels.x(), quadSizePixels.y());

		if (m_depthStencilFmt != GL_NONE)
		{
			glGenRenderbuffers					(1, &depthStencilRbo);
			glBindRenderbuffer					(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorageMultisample	(GL_RENDERBUFFER, m_numSamples, m_depthStencilFmt, quadSizePixels.x(), quadSizePixels.y());
		}

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

		if (depth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		if (stencil)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), -1.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Set default framebuffer as draw framebuffer and blit preserved buffers.
		glBindFramebuffer	(GL_DRAW_FRAMEBUFFER, 0);
		glBlitFramebuffer	(blitX0, blitY0, blitX1, blitY1, blitX0, blitY0, blitX1, blitY1, (GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT) & ~m_invalidateBuffers, GL_NEAREST);
		glBindFramebuffer	(GL_READ_FRAMEBUFFER, 0);

		if ((m_invalidateBuffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), 0.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if ((m_invalidateBuffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_invalidateBuffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), 0.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 0.0f));

		readPixels(dst, 0, 0, quadSizePixels.x(), quadSizePixels.y());
	}